

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

int __thiscall
trompeloeil::list_elem<trompeloeil::sequence_matcher>::unlink
          (list_elem<trompeloeil::sequence_matcher> *this,char *__name)

{
  long lVar1;
  long lVar2;
  int extraout_EAX;
  list_elem<trompeloeil::sequence_matcher> *p;
  list_elem<trompeloeil::sequence_matcher> *n;
  list_elem<trompeloeil::sequence_matcher> *this_local;
  
  invariant_check(this);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  *(long *)(lVar1 + 0x10) = lVar2;
  *(long *)(lVar2 + 8) = lVar1;
  *(list_elem<trompeloeil::sequence_matcher> **)(this + 8) = this;
  *(list_elem<trompeloeil::sequence_matcher> **)(this + 0x10) = this;
  invariant_check(this);
  return extraout_EAX;
}

Assistant:

void
    unlink()
    noexcept
    {
      invariant_check();
      auto n = next;
      auto p = prev;
      n->prev = p;
      p->next = n;
      next = this;
      prev = this;
      invariant_check();
    }